

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void Fl_X::activate_window(Window w)

{
  int iVar1;
  Window d2;
  unsigned_long in_stack_00000008;
  
  iVar1 = ewmh_supported();
  if (iVar1 == 0) {
    return;
  }
  if (fl_xfocus == (Fl_Window *)0x0) {
    d2 = 0;
  }
  else {
    if (fl_xfocus->i == (Fl_X *)0x0) {
      return;
    }
    d2 = fl_xfocus->i->xid;
  }
  send_wm_event(w,fl_NET_ACTIVE_WINDOW,1,0,d2,0,in_stack_00000008);
  return;
}

Assistant:

void Fl_X::activate_window(Window w) {
  if (!ewmh_supported())
    return;

  Window prev = 0;

  if (fl_xfocus) {
    Fl_X *x = Fl_X::i(fl_xfocus);
    if (!x)
      return;
    prev = x->xid;
  }

  send_wm_event(w, fl_NET_ACTIVE_WINDOW, 1 /* application */,
                0 /* timestamp */, prev /* previously active window */);
}